

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

fp fmt::v9::detail::get_cached_power(int min_exponent,int *pow10_exponent)

{
  int iVar1;
  fp fVar2;
  
  iVar1 = ((int)((ulong)((long)(min_exponent + 0x3f) * 0x4d104d42 + 0xffffffff) >> 0x20) + 0x15b) /
          8;
  *pow10_exponent = iVar1 * 8 + -0x154;
  fVar2.e = (int)basic_data<void>::pow10_exponents[(long)iVar1 + 1];
  fVar2.f = basic_data<void>::pow10_significands[(long)iVar1 + 1];
  fVar2._12_4_ = 0;
  return fVar2;
}

Assistant:

FMT_CONSTEXPR inline fp get_cached_power(int min_exponent,
                                         int& pow10_exponent) {
  const int shift = 32;
  // log10(2) = 0x0.4d104d427de7fbcc...
  const int64_t significand = 0x4d104d427de7fbcc;
  int index = static_cast<int>(
      ((min_exponent + fp::num_significand_bits - 1) * (significand >> shift) +
       ((int64_t(1) << shift) - 1))  // ceil
      >> 32                          // arithmetic shift
  );
  // Decimal exponent of the first (smallest) cached power of 10.
  const int first_dec_exp = -348;
  // Difference between 2 consecutive decimal exponents in cached powers of 10.
  const int dec_exp_step = 8;
  index = (index - first_dec_exp - 1) / dec_exp_step + 1;
  pow10_exponent = first_dec_exp + index * dec_exp_step;
  // Using *(x + index) instead of x[index] avoids an issue with some compilers
  // using the EDG frontend (e.g. nvhpc/22.3 in C++17 mode).
  return {*(data::pow10_significands + index),
          *(data::pow10_exponents + index)};
}